

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O2

bool __thiscall cmCTestHandlerCommand::CheckArgumentKeyword(cmCTestHandlerCommand *this,string *arg)

{
  pointer ppcVar1;
  char *__rhs;
  bool bVar2;
  uint k;
  ulong uVar3;
  
  bVar2 = std::operator==(arg,"APPEND");
  if (bVar2) {
    this->ArgumentDoing = 0;
    this->AppendXML = true;
  }
  else {
    bVar2 = std::operator==(arg,"QUIET");
    if (bVar2) {
      this->ArgumentDoing = 0;
      this->Quiet = true;
    }
    else {
      uVar3 = 0;
      while( true ) {
        ppcVar1 = (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->Arguments).
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar3) {
          return false;
        }
        __rhs = ppcVar1[uVar3];
        if ((__rhs != (char *)0x0) && (bVar2 = std::operator==(arg,__rhs), bVar2)) break;
        uVar3 = (ulong)((uint)uVar3 + 1);
      }
      this->ArgumentDoing = 2;
      this->ArgumentIndex = (uint)uVar3;
    }
  }
  return true;
}

Assistant:

bool cmCTestHandlerCommand::CheckArgumentKeyword(std::string const& arg)
{
  // Look for non-value arguments common to all commands.
  if (arg == "APPEND") {
    this->ArgumentDoing = ArgumentDoingNone;
    this->AppendXML = true;
    return true;
  }
  if (arg == "QUIET") {
    this->ArgumentDoing = ArgumentDoingNone;
    this->Quiet = true;
    return true;
  }

  // Check for a keyword in our argument/value table.
  for (unsigned int k = 0; k < this->Arguments.size(); ++k) {
    if (this->Arguments[k] && arg == this->Arguments[k]) {
      this->ArgumentDoing = ArgumentDoingKeyword;
      this->ArgumentIndex = k;
      return true;
    }
  }
  return false;
}